

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeContainer.hpp
# Opt level: O0

ElemPtr __thiscall
OpenMD::TypeContainer<OpenMD::TorsionType,_4>::find
          (TypeContainer<OpenMD::TorsionType,_4> *this,KeyType *keys,string *wildCard)

{
  bool bVar1;
  pointer ppVar2;
  iterator j;
  KeyType allWildCards;
  KeyType reversedKeys;
  vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
  foundTypes;
  MapTypeIterator i;
  KeyType replacedKey;
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  iterCont;
  map<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>_>
  *in_stack_fffffffffffffe78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffe88;
  TorsionType *pTVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffe90;
  __normal_iterator<std::pair<int,_OpenMD::TorsionType_*>_*,_std::vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>_>
  __last;
  __normal_iterator<std::pair<int,_OpenMD::TorsionType_*>_*,_std::vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>_>
  in_stack_fffffffffffffe98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffec8;
  iterator in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffef8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  __normal_iterator<std::pair<int,_OpenMD::TorsionType_*>_*,_std::vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>_>
  in_stack_ffffffffffffff08;
  _Self in_stack_ffffffffffffff10;
  _Self local_c0;
  _Base_ptr local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  _Self local_88;
  _Base_ptr local_80;
  pair<int,_OpenMD::TorsionType_*> local_68;
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>
  local_50 [10];
  
  std::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::vector((vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)0x1cdff9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1ce006);
  std::
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>
  ::_Rb_tree_iterator(local_50);
  std::
  vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
  ::vector((vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
            *)0x1ce020);
  while (bVar1 = replaceWithWildCard((vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                      *)in_stack_ffffffffffffff10._M_node,
                                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)in_stack_ffffffffffffff08._M_current,
                                     in_stack_ffffffffffffff00,in_stack_fffffffffffffef8), bVar1) {
    in_stack_fffffffffffffed0 =
         std::
         map<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>_>
         ::find(in_stack_fffffffffffffe78,(key_type *)0x1ce06e);
    local_80 = in_stack_fffffffffffffed0._M_node;
    local_50[0]._M_node = in_stack_fffffffffffffed0._M_node;
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>_>
         ::end(in_stack_fffffffffffffe78);
    bVar1 = std::operator!=(local_50,&local_88);
    if (bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>
                    *)0x1ce0d0);
      std::
      vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
      ::push_back((vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
                   *)in_stack_fffffffffffffe90._M_current,
                  (value_type *)in_stack_fffffffffffffe88._M_current);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffed0._M_node,in_stack_fffffffffffffec8);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe78);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe78);
  std::
  reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  bVar1 = std::operator!=(in_stack_fffffffffffffe80,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffe78);
  if (bVar1) {
    std::
    vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::clear((vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             *)0x1ce195);
    while (bVar1 = replaceWithWildCard((vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                        *)in_stack_ffffffffffffff10._M_node,
                                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)in_stack_ffffffffffffff08._M_current,
                                       in_stack_ffffffffffffff00,in_stack_fffffffffffffef8), bVar1)
    {
      local_b8 = (_Base_ptr)
                 std::
                 map<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>_>
                 ::find(in_stack_fffffffffffffe78,(key_type *)0x1ce1e3);
      local_50[0]._M_node = local_b8;
      local_c0._M_node =
           (_Base_ptr)
           std::
           map<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>_>
           ::end(in_stack_fffffffffffffe78);
      bVar1 = std::operator!=(local_50,&local_c0);
      if (bVar1) {
        std::
        _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>
                      *)0x1ce245);
        std::
        vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
        ::push_back((vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
                     *)in_stack_fffffffffffffe90._M_current,
                    (value_type *)in_stack_fffffffffffffe88._M_current);
      }
    }
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1ce29a);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98._M_current,
             in_stack_fffffffffffffe90._M_current,
             (allocator_type *)in_stack_fffffffffffffe88._M_current);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1ce2c5);
    local_50[0]._M_node =
         (_Base_ptr)
         std::
         map<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>_>
         ::find(in_stack_fffffffffffffe78,(key_type *)0x1ce2db);
    std::
    map<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>_>
    ::end(in_stack_fffffffffffffe78);
    bVar1 = std::operator!=(local_50,(_Self *)&stack0xffffffffffffff10);
    if (bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::TorsionType_*>_>_>
                    *)0x1ce33d);
      std::
      vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
      ::push_back((vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
                   *)in_stack_fffffffffffffe90._M_current,
                  (value_type *)in_stack_fffffffffffffe88._M_current);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe90._M_current);
  }
  __gnu_cxx::
  __normal_iterator<std::pair<int,_OpenMD::TorsionType_*>_*,_std::vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>_>
  ::__normal_iterator((__normal_iterator<std::pair<int,_OpenMD::TorsionType_*>_*,_std::vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>_>
                       *)&stack0xffffffffffffff08);
  __last._M_current = &local_68;
  std::
  vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
  ::begin((vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
           *)in_stack_fffffffffffffe78);
  std::
  vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
  ::end((vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
         *)in_stack_fffffffffffffe78);
  std::
  min_element<__gnu_cxx::__normal_iterator<std::pair<int,OpenMD::TorsionType*>*,std::vector<std::pair<int,OpenMD::TorsionType*>,std::allocator<std::pair<int,OpenMD::TorsionType*>>>>>
            (in_stack_fffffffffffffe98,__last);
  std::
  vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
  ::end((vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
         *)in_stack_fffffffffffffe78);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::pair<int,_OpenMD::TorsionType_*>_*,_std::vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>_>
                      *)in_stack_fffffffffffffe80,
                     (__normal_iterator<std::pair<int,_OpenMD::TorsionType_*>_*,_std::vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>_>
                      *)in_stack_fffffffffffffe78);
  if (bVar1) {
    pTVar3 = (TorsionType *)0x0;
  }
  else {
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<int,_OpenMD::TorsionType_*>_*,_std::vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>_>
             ::operator->((__normal_iterator<std::pair<int,_OpenMD::TorsionType_*>_*,_std::vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>_>
                           *)&stack0xffffffffffffff08);
    pTVar3 = ppVar2->second;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)__last._M_current);
  std::
  vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
  ::~vector((vector<std::pair<int,_OpenMD::TorsionType_*>,_std::allocator<std::pair<int,_OpenMD::TorsionType_*>_>_>
             *)__last._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)__last._M_current);
  std::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~vector((vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             *)__last._M_current);
  return pTVar3;
}

Assistant:

ElemPtr find(KeyType& keys, const std::string& wildCard) {
      assert(keys.size() == SIZE);

      std::vector<KeyTypeIterator> iterCont;
      KeyType replacedKey;
      MapTypeIterator i;
      std::vector<ValueType> foundTypes;

      while (replaceWithWildCard(iterCont, keys, replacedKey, wildCard)) {
        i = data_.find(replacedKey);
        if (i != data_.end()) { foundTypes.push_back(i->second); }
      }

      // reverse the order of keys
      KeyType reversedKeys = keys;
      std::reverse(reversedKeys.begin(), reversedKeys.end());

      // if the reversedKeys is the same as keys, just skip it
      if (reversedKeys != keys) {
        // empty the iterator container
        iterCont.clear();

        while (replaceWithWildCard(iterCont, reversedKeys, replacedKey,
                                   wildCard)) {
          i = data_.find(replacedKey);
          if (i != data_.end()) { foundTypes.push_back(i->second); }
        }

        // replaceWithWildCard can not generate this particular sequence, we
        // have to do it manually
        KeyType allWildCards(SIZE, wildCard);
        i = data_.find(allWildCards);
        if (i != data_.end()) { foundTypes.push_back(i->second); }
      }

      typename std::vector<ValueType>::iterator j;
      j = std::min_element(foundTypes.begin(), foundTypes.end());
      return j == foundTypes.end() ? NULL : j->second;
    }